

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FBaseCVar::~FBaseCVar(FBaseCVar *this)

{
  FBaseCVar *local_20;
  FBaseCVar *prev;
  FBaseCVar *var;
  FBaseCVar *this_local;
  
  this->_vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_009f18d0;
  if (this->Name != (char *)0x0) {
    var = this;
    prev = FindCVar(this->Name,&local_20);
    if (prev == this) {
      if (local_20 == (FBaseCVar *)0x0) {
        CVars = this->m_Next;
      }
      else {
        local_20->m_Next = this->m_Next;
      }
    }
    C_RemoveTabCommand(this->Name);
    if (this->Name != (char *)0x0) {
      operator_delete__(this->Name);
    }
  }
  return;
}

Assistant:

FBaseCVar::~FBaseCVar ()
{
	if (Name)
	{
		FBaseCVar *var, *prev;

		var = FindCVar (Name, &prev);

		if (var == this)
		{
			if (prev)
				prev->m_Next = m_Next;
			else
				CVars = m_Next;
		}
		C_RemoveTabCommand(Name);
		delete[] Name;
	}
}